

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBase.cpp
# Opt level: O0

void __thiscall DataBase::DataBase(DataBase *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar1;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  string *local_18;
  DataBase *local_10;
  DataBase *this_local;
  
  this->in_var_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
        *)0x0;
  this->sim_var_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
        *)0x0;
  local_10 = this;
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->updates_to_sim);
  local_18 = (string *)this->sim_var_index;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)this->sim_var_index,"/instrumentation/airspeed-indicator/indicated-speed-kt",
             &local_19);
  local_18 = (string *)(this->sim_var_index + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(this->sim_var_index + 1),"/sim/time/warp",local_2d);
  local_18 = (string *)(this->sim_var_index + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 2),"/controls/switches/magnetos",&local_2e);
  local_18 = (string *)(this->sim_var_index + 3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 3),"/instrumentation/heading-indicator/offset-deg",
             &local_2f);
  local_18 = (string *)(this->sim_var_index + 4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 4),"/instrumentation/altimeter/indicated-altitude-ft",
             &local_30);
  local_18 = (string *)(this->sim_var_index + 5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 5),"/instrumentation/altimeter/pressure-alt-ft",
             &local_31);
  local_18 = (string *)(this->sim_var_index + 6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 6),
             "/instrumentation/attitude-indicator/indicated-pitch-deg",&local_32);
  local_18 = (string *)(this->sim_var_index + 7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 7),
             "/instrumentation/attitude-indicator/indicated-roll-deg",&local_33);
  local_18 = (string *)(this->sim_var_index + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 8),
             "/instrumentation/attitude-indicator/internal-pitch-deg",&local_34);
  local_18 = (string *)(this->sim_var_index + 9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 9),
             "/instrumentation/attitude-indicator/internal-roll-deg",&local_35);
  local_18 = (string *)(this->sim_var_index + 10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 10),"/instrumentation/encoder/indicated-altitude-ft",
             &local_36);
  local_18 = (string *)(this->sim_var_index + 0xb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xb),"/instrumentation/encoder/pressure-alt-ft",
             &local_37);
  local_18 = (string *)(this->sim_var_index + 0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xc),"/instrumentation/gps/indicated-altitude-ft",
             &local_38);
  local_18 = (string *)(this->sim_var_index + 0xd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xd),"/instrumentation/gps/indicated-ground-speed-kt",
             &local_39);
  local_18 = (string *)(this->sim_var_index + 0xe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xe),"/instrumentation/gps/indicated-vertical-speed",
             &local_3a);
  local_18 = (string *)(this->sim_var_index + 0xf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xf),
             "/instrumentation/heading-indicator/indicated-heading-deg",&local_3b);
  local_18 = (string *)(this->sim_var_index + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x10),
             "/instrumentation/magnetic-compass/indicated-heading-deg",&local_3c);
  local_18 = (string *)(this->sim_var_index + 0x11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x11),
             "/instrumentation/slip-skid-ball/indicated-slip-skid",&local_3d);
  local_18 = (string *)(this->sim_var_index + 0x12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x12),
             "/instrumentation/turn-indicator/indicated-turn-rate",&local_3e);
  local_18 = (string *)(this->sim_var_index + 0x13);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x13),
             "/instrumentation/vertical-speed-indicator/indicated-speed-fpm",&local_3f);
  local_18 = (string *)(this->sim_var_index + 0x14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x14),"/controls/flight/aileron",&local_40);
  local_18 = (string *)(this->sim_var_index + 0x15);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x15),"/controls/flight/elevator",&local_41);
  local_18 = (string *)(this->sim_var_index + 0x16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x16),"/controls/flight/rudder",&local_42);
  local_18 = (string *)(this->sim_var_index + 0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x17),"/controls/flight/flaps",&local_43);
  local_18 = (string *)(this->sim_var_index + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x18),"/controls/engines/engine/throttle",&local_44);
  local_18 = (string *)(this->sim_var_index + 0x19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x19),"/controls/engines/current-engine/throttle",
             &local_45);
  local_18 = (string *)(this->sim_var_index + 0x1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1a),"/controls/switches/master-avionics",&local_46);
  local_18 = (string *)(this->sim_var_index + 0x1b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1b),"/controls/switches/starter",&local_47);
  local_18 = (string *)(this->sim_var_index + 0x1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1c),"/engines/active-engine/auto-start",&local_48);
  local_18 = (string *)(this->sim_var_index + 0x1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1d),"/controls/flight/speedbrake",&local_49);
  local_18 = (string *)(this->sim_var_index + 0x1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1e),"/sim/model/c172p/brake-parking",&local_4a);
  local_18 = (string *)(this->sim_var_index + 0x1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1f),"/controls/engines/engine/primer",&local_4b);
  local_18 = (string *)(this->sim_var_index + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x20),"/controls/engines/current-engine/mixture",
             &local_4c);
  local_18 = (string *)(this->sim_var_index + 0x21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x21),"/controls/switches/master-bat",&local_4d);
  local_18 = (string *)(this->sim_var_index + 0x22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x22),"/controls/switches/master-alt",&local_4e);
  local_18 = (string *)(this->sim_var_index + 0x23);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x23),"/engines/engine/rpm",&local_4f);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_47);
  std::allocator<char>::~allocator((allocator<char> *)&local_46);
  std::allocator<char>::~allocator((allocator<char> *)&local_45);
  std::allocator<char>::~allocator((allocator<char> *)&local_44);
  std::allocator<char>::~allocator((allocator<char> *)&local_43);
  std::allocator<char>::~allocator((allocator<char> *)&local_42);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_37);
  std::allocator<char>::~allocator((allocator<char> *)&local_36);
  std::allocator<char>::~allocator((allocator<char> *)&local_35);
  std::allocator<char>::~allocator((allocator<char> *)&local_34);
  std::allocator<char>::~allocator((allocator<char> *)&local_33);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  this->is_running = false;
  std::mutex::mutex(&this->sim_var_map_lock);
  std::mutex::mutex(&this->in_var_map_lock);
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            *)operator_new(0x30);
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  ::map(pmVar1);
  this->in_var_map = pmVar1;
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            *)operator_new(0x30);
  memset(pmVar1,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  ::map(pmVar1);
  this->sim_var_map = pmVar1;
  return;
}

Assistant:

DataBase::DataBase() {
  this->in_var_map = new map<string, Variable *>();
  this->sim_var_map = new map<string, Variable *>();
}